

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O2

Matrix<float,_2,_2> __thiscall
deqp::gles3::Functional::MatrixCaseUtils::outerProduct<float,2,2>
          (MatrixCaseUtils *this,Vector<float,_2> *a,Vector<float,_2> *b)

{
  float fVar1;
  int r;
  long lVar2;
  int c;
  long lVar3;
  float *this_00;
  Matrix<float,_2,_2> MVar4;
  Matrix<float,_2,_2> retVal;
  Matrix<float,_2,_2> local_30;
  
  this_00 = (float *)&local_30;
  tcu::Matrix<float,_2,_2>::Matrix((Matrix<float,_2,_2> *)this_00);
  for (lVar2 = 0; lVar2 != 2; lVar2 = lVar2 + 1) {
    fVar1 = b->m_data[lVar2];
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      this_00[lVar3 * 2] = a->m_data[lVar3] * fVar1;
    }
    this_00 = this_00 + 1;
  }
  MVar4 = tcu::transpose<float,2,2>((tcu *)this,&local_30);
  return (Vector<tcu::Vector<float,_2>,_2>)(Vector<tcu::Vector<float,_2>,_2>)MVar4;
}

Assistant:

tcu::Matrix<T, Cols, Rows> outerProduct (const tcu::Vector<T, Cols>& a, const tcu::Vector<T, Rows>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a[c] * b[r];

	return transpose(retVal); // to gl-form (column-major)
}